

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

void __thiscall cm::String::String(String *this,string *s,Private param_2)

{
  char *__str;
  size_type __len;
  undefined1 local_30 [28];
  Private param_2_local;
  string *s_local;
  String *this_local;
  
  local_30._20_4_ = param_2;
  unique0x100000bc = s;
  s_local = (string *)this;
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::shared_ptr<std::__cxx11::string_const>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string_const> *)this,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_30);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_30);
  std::
  __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  __str = (char *)std::__cxx11::string::data();
  std::
  __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  __len = std::__cxx11::string::size();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->view_,__str,__len)
  ;
  return;
}

Assistant:

String::String(std::string&& s, Private)
  : string_(std::make_shared<std::string>(std::move(s)))
  , view_(this->string_->data(), this->string_->size())
{
}